

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::makeNewNonarray(Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  string *hint;
  bool bVar1;
  element_type *peVar2;
  shared_ptr<mocker::ast::Type> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Addr> sVar3;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ctorName;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  shared_ptr<mocker::ir::Reg> instancePtr;
  shared_ptr<mocker::ir::Addr> typeSize;
  shared_ptr<mocker::ast::BuiltinType> p;
  shared_ptr<mocker::ast::Type> *type_local;
  Builder *this_local;
  
  std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)
             &p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!std::dynamic_pointer_cast<ast::ArrayType>(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x3bc,
                  "std::shared_ptr<Addr> mocker::ir::Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &) const"
                 );
  }
  std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
            ((shared_ptr<mocker::ast::ArrayType> *)
             &p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::dynamic_pointer_cast<mocker::ast::BuiltinType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)
             &typeSize.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &typeSize.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if ((bVar1) &&
     (peVar2 = std::
               __shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&typeSize.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), peVar2->type != String)) {
    __assert_fail("p->type == ast::BuiltinType::String",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x3be,
                  "std::shared_ptr<Addr> mocker::ir::Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &) const"
                 );
  }
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr
            ((shared_ptr<mocker::ast::BuiltinType> *)
             &typeSize.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  getTypeSize((Builder *)type,in_RDX);
  makeILit((Builder *)
           &instancePtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           (Integer)type);
  hint = (string *)
         (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"instPtr",&local_81);
  BuilderContext::makeTempLocalReg((BuilderContext *)local_60,hint);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  BuilderContext::
  emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(shared_ptr<mocker::ir::Reg> *)local_60,
             (shared_ptr<mocker::ir::Addr> *)
             &instancePtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  getTypeIdentifier_abi_cxx11_(&local_f8,(Builder *)type,in_RDX);
  std::operator+(&local_d8,"#",&local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 &local_d8,"#_ctor_");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  BuilderContext::
  emplaceInst<mocker::ir::Call,std::__cxx11::string&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (shared_ptr<mocker::ir::Reg> *)local_60);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
            ((shared_ptr<mocker::ir::Addr> *)this,(shared_ptr<mocker::ir::Reg> *)local_60);
  std::__cxx11::string::~string((string *)local_b8);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_60);
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr
            ((shared_ptr<mocker::ir::Addr> *)
             &instancePtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar3.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr>
Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &type) const {
  assert(!std::dynamic_pointer_cast<ast::ArrayType>(type));
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type))
    assert(p->type == ast::BuiltinType::String);

  auto typeSize = makeILit((Integer)getTypeSize(type));
  auto instancePtr = ctx.makeTempLocalReg("instPtr");
  ctx.emplaceInst<Malloc>(instancePtr, typeSize);
  auto ctorName = "#" + getTypeIdentifier(type) + "#_ctor_";
  ctx.emplaceInst<Call>(ctorName, instancePtr);
  return instancePtr;
}